

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_unpackhi_s16_s32(c_v256 a)

{
  c_v256 *in_RDI;
  
  in_RDI->u64[2] = CONCAT44(a.s32[6] >> 0x10,(int)a.s16[0xc]);
  in_RDI->u64[3] = CONCAT44(a.s32[7] >> 0x10,a.s64[3]._2_4_ >> 0x10);
  in_RDI->u64[0] = CONCAT44(a.s32[4] >> 0x10,(int)a.s16[8]);
  in_RDI->u64[1] = CONCAT44(a.s32[5] >> 0x10,a.s64[2]._2_4_ >> 0x10);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpackhi_s16_s32(c_v256 a) {
  return c_v256_from_v128(c_v128_unpackhi_s16_s32(a.v128[1]),
                          c_v128_unpacklo_s16_s32(a.v128[1]));
}